

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

void __thiscall FIX40::Message::Message(Message *this,MsgType *msgtype)

{
  allocator<char> local_99;
  STRING local_98;
  FieldBase local_78;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"FIX.4.0",&local_99);
  FIX::BeginString::BeginString((BeginString *)&local_78,&local_98);
  FIX::Message::Message(&this->super_Message,(BeginString *)&local_78,msgtype);
  FIX::FieldBase::~FieldBase(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  *(undefined ***)this = &PTR__Message_0017eb08;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIX.4.0"), msgtype )
     {}